

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

bool __thiscall
senjo::BackgroundCommand::ParseAndExecute(BackgroundCommand *this,char *params,Thread *thread)

{
  bool bVar1;
  uint uVar2;
  Output local_48 [3];
  Output local_30;
  Thread *local_28;
  Thread *thread_local;
  char *params_local;
  BackgroundCommand *this_local;
  
  local_28 = thread;
  thread_local = (Thread *)params;
  params_local = (char *)this;
  if (this->engine == (ChessEngine *)0x0) {
    Output::Output(&local_30,InfoPrefix);
    Output::operator<<(&local_30,(char (*) [38])"Engine not set for background command");
    Output::~Output(&local_30);
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (*this->_vptr_BackgroundCommand[5])(this,params);
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = Thread::Active(local_28);
      if (bVar1) {
        Output::Output(local_48,InfoPrefix);
        Output::operator<<(local_48,(char (*) [58])
                                    "Another background command is still active, can\'t execute");
        Output::~Output(local_48);
        this_local._7_1_ = false;
      }
      else {
        uVar2 = (*this->engine->_vptr_ChessEngine[8])();
        if ((uVar2 & 1) == 0) {
          (*this->engine->_vptr_ChessEngine[7])();
        }
        this_local._7_1_ = Thread::Start(local_28,Run,this);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BackgroundCommand::ParseAndExecute(const char* params, Thread& thread)
{
  if (!engine) {
    Output() << "Engine not set for background command";
    return false;
  }

  if (!Parse(params)) {
    return false;
  }

  if (thread.Active()) {
    Output() << "Another background command is still active, can't execute";
    return false;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }

  return thread.Start(BackgroundCommand::Run, this);
}